

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O3

void __thiscall
discordpp::
field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
::field(field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
        *this,field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
              *f)

{
  _Head_base<0UL,_std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_*,_false>
  __x;
  _Head_base<0UL,_std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_*,_false>
  this_00;
  
  __x._M_head_impl =
       (f->t_)._M_t.
       super___uniq_ptr_impl<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>,_std::default_delete<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_*,_std::default_delete<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>_>
       .
       super__Head_base<0UL,_std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_*,_false>
       ._M_head_impl;
  if (__x._M_head_impl ==
      (vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>
       *)0x0) {
    this_00._M_head_impl =
         (vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>
          *)0x0;
  }
  else {
    this_00._M_head_impl =
         (vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>
          *)operator_new(0x18);
    std::
    vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>
    ::vector(this_00._M_head_impl,__x._M_head_impl);
  }
  (this->t_)._M_t.
  super___uniq_ptr_impl<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>,_std::default_delete<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_*,_std::default_delete<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_*,_false>
  ._M_head_impl = this_00._M_head_impl;
  this->s_ = f->s_;
  return;
}

Assistant:

field(const field<T> &f)
        : t_(f.t_ ? std::make_unique<T>(*f.t_) : nullptr), s_(f.s_) {}